

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

Hash Fossilize::Hashing::compute_hash_physical_device_features(void *device_pnext)

{
  VkPhysicalDeviceFeatures2 *pVVar1;
  Hash HVar2;
  VkPhysicalDeviceFeatures2 *pdf2;
  Hasher h;
  void *device_pnext_local;
  
  h.h = (Hash)device_pnext;
  Hasher::Hasher((Hasher *)&pdf2);
  pVVar1 = find_pnext<VkPhysicalDeviceFeatures2>
                     (VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2,(void *)h.h);
  if (pVVar1 == (VkPhysicalDeviceFeatures2 *)0x0) {
    Hasher::u32((Hasher *)&pdf2,0);
  }
  else {
    Hasher::u32((Hasher *)&pdf2,(pVVar1->features).robustBufferAccess);
  }
  hash_pnext_chain_pdf2((StateRecorder *)0x0,(Hasher *)&pdf2,(void *)h.h);
  HVar2 = Hasher::get((Hasher *)&pdf2);
  return HVar2;
}

Assistant:

static Hash compute_hash_physical_device_features(const void *device_pnext)
{
	Hasher h;

	// For hash invariance, make sure we hash PDF2 first, since when we serialize and unserialize,
	// PDF2 will always come first in the chain.
	auto *pdf2 = find_pnext<VkPhysicalDeviceFeatures2>(VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2, device_pnext);
	if (pdf2)
		h.u32(pdf2->features.robustBufferAccess);
	else
		h.u32(0);

	hash_pnext_chain_pdf2(nullptr, h, device_pnext);
	return h.get();
}